

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

bool __thiscall
JsUtil::
BaseDictionary<void*,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::SimpleDictionaryEntry,JsUtil::AsymetricResizeLock>
::FindEntryWithKey<void*>
          (BaseDictionary<void*,unsigned_long,Memory::HeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,RecyclerPointerComparer,JsUtil::SimpleDictionaryEntry,JsUtil::AsymetricResizeLock>
           *this,void **key,int *i,int *last,uint *targetBucket)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  hash_t hashCode_00;
  uint uVar4;
  EntryType *localEntries;
  hash_t hashCode;
  int *localBuckets;
  uint depth;
  uint *targetBucket_local;
  int *last_local;
  int *i_local;
  void **key_local;
  BaseDictionary<void_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::AsymetricResizeLock>
  *this_local;
  
  localBuckets._4_4_ = 0;
  lVar1 = *(long *)(this + 0x40);
  if (lVar1 != 0) {
    hashCode_00 = GetHashCodeWithKey<void*>(key);
    uVar4 = BaseDictionary<void_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::AsymetricResizeLock>
            ::GetBucket((BaseDictionary<void_*,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_RecyclerPointerComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::AsymetricResizeLock>
                         *)this,hashCode_00);
    *targetBucket = uVar4;
    *last = -1;
    lVar2 = *(long *)(this + 0x48);
    *i = *(int *)(lVar1 + (ulong)*targetBucket * 4);
    while (-1 < *i) {
      bVar3 = DefaultHashedEntry<void*,unsigned_long,JsUtil::(anonymous_namespace)::KeyValueEntry>::
              KeyEquals<RecyclerPointerComparer<void*>,void*>
                        ((DefaultHashedEntry<void*,unsigned_long,JsUtil::(anonymous_namespace)::KeyValueEntry>
                          *)(lVar2 + (long)*i * 0x18),key,hashCode_00);
      if (bVar3) {
        if (*(long *)(this + 0x70) != 0) {
          DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x70),localBuckets._4_4_);
        }
        return true;
      }
      localBuckets._4_4_ = localBuckets._4_4_ + 1;
      *last = *i;
      *i = *(int *)(lVar2 + (long)*i * 0x18 + 8);
    }
  }
  if (*(long *)(this + 0x70) != 0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x70),localBuckets._4_4_);
  }
  return false;
}

Assistant:

inline bool FindEntryWithKey(const LookupType& key, int *const i, int *const last, uint *const targetBucket)
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                *targetBucket = this->GetBucket(hashCode);
                *last = -1;
                EntryType * localEntries = entries;
                for (*i = localBuckets[*targetBucket]; *i >= 0; *last = *i, *i = localEntries[*i].next)
                {
                    if (localEntries[*i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return true;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }
#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return false;
        }